

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

void trstep_ddl(double *jac,double *sN,int N,double *dx,double maxstep,double *L,double *hess,
               double nlen,double *ioval,double *ssd,double *v,double *step)

{
  double dVar1;
  long lVar2;
  double *vec;
  double *C;
  double *C_00;
  double *C_01;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar8 = (ulong)(uint)N;
  dVar13 = *ioval;
  dVar14 = ioval[1];
  dVar15 = ioval[2];
  lVar2 = (long)N;
  vec = (double *)malloc(lVar2 * 8);
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  C_01 = (double *)malloc(8);
  if (nlen <= dVar13) {
    ioval[6] = 1.0;
    uVar4 = 0;
    if (N < 1) {
      uVar8 = 0;
    }
    for (; dVar13 = nlen, uVar8 != uVar4; uVar4 = uVar4 + 1) {
      step[uVar4] = sN[uVar4];
    }
  }
  else {
    ioval[6] = 0.0;
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      uVar3 = 0;
      uVar4 = 0;
      if (0 < N) {
        uVar4 = uVar8;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        vec[uVar3] = jac[uVar3] / dx[uVar3];
      }
      dVar11 = l2norm(vec,N);
      dVar14 = 0.0;
      uVar3 = uVar8;
      pdVar6 = jac;
      pdVar7 = dx;
      for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        dVar15 = 0.0;
        pdVar10 = L;
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          dVar15 = dVar15 + (*pdVar10 * pdVar6[uVar9]) / (pdVar7[uVar9] * pdVar7[uVar9]);
          pdVar10 = pdVar10 + lVar2;
        }
        dVar14 = dVar14 + dVar15 * dVar15;
        uVar3 = uVar3 - 1;
        pdVar7 = pdVar7 + 1;
        pdVar6 = pdVar6 + 1;
        L = L + lVar2 + 1;
      }
      dVar11 = dVar11 * dVar11;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        ssd[uVar3] = (jac[uVar3] * (-dVar11 / dVar14)) / dx[uVar3];
      }
      mmult(jac,sN,C,1,N,1);
      dVar15 = (dVar11 * 0.8 * dVar11) / (ABS(*C) * dVar14) + 0.2;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        v[uVar3] = dx[uVar3] * dVar15 * sN[uVar3] - ssd[uVar3];
      }
      dVar14 = (SQRT(dVar11) * dVar11) / dVar14;
      if (((dVar13 == -1.0) && (!NAN(dVar13))) && (dVar13 = dVar14, maxstep <= dVar14)) {
        dVar13 = maxstep;
      }
    }
    if (dVar13 < dVar15 * nlen) {
      if (dVar13 <= dVar14) {
        uVar4 = 0;
        uVar8 = (ulong)(uint)N;
        if (N < 1) {
          uVar8 = uVar4;
        }
        for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
          step[uVar4] = (ssd[uVar4] * (dVar13 / dVar14)) / dx[uVar4];
        }
      }
      else {
        mmult(v,ssd,C_00,1,N,1);
        mmult(v,v,C_01,1,N,1);
        dVar11 = *C_00;
        dVar12 = dVar11 * dVar11 - (dVar14 * dVar14 - dVar13 * dVar13) * *C_01;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        dVar1 = *C_01;
        uVar4 = 0;
        if (N < 1) {
          uVar8 = uVar4;
        }
        for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
          step[uVar4] = (v[uVar4] * ((dVar12 - dVar11) / dVar1)) / dx[uVar4] +
                        ssd[uVar4] / dx[uVar4];
        }
      }
    }
    else {
      uVar4 = 0;
      uVar8 = (ulong)(uint)N;
      if (N < 1) {
        uVar8 = uVar4;
      }
      for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        step[uVar4] = sN[uVar4] * (dVar13 / nlen);
      }
    }
  }
  *ioval = dVar13;
  ioval[1] = dVar14;
  ioval[2] = dVar15;
  free(vec);
  free(C_00);
  free(C_01);
  free(C);
  return;
}

Assistant:

void trstep_ddl(double *jac,double *sN,int N,double * dx,double maxstep,double *L,double *hess,double nlen,double *ioval,
		double *ssd,double *v,double *step) {
	int i,j;
	double tvec,temp;
	double alpha,beta;
	double delta,clen,neta,lambda;
	double *temp1,*slstep;
	double *t1,*t2;
	
	
	delta = ioval[0];clen = ioval[1]; neta = ioval[2];
	
	temp1 = (double*) malloc(sizeof(double) *N);
	slstep = (double*) malloc(sizeof(double) *1);
	t1 = (double*) malloc(sizeof(double) *1);
	t2 = (double*) malloc(sizeof(double) *1);
	
	if (nlen <= delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		delta = nlen;
		
	} else {
		ioval[6] = 0.0;
		if (ioval[7] == 1.0) {
			ioval[7] = 0.0;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i] / dx[i];
			}
			
			tvec = l2norm(temp1,N);
			alpha = tvec*tvec;
			beta = 0.0; 
			
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N + i] * jac[j] /(dx[j] * dx[j]);
				}
				beta += temp*temp;
			}
			tvec = - alpha / beta;
			for (i = 0; i < N;++i) {
				ssd[i] = tvec * jac[i] / dx[i];
			}
			
			clen = alpha * sqrt(alpha) / beta;
			mmult(jac,sN,slstep,1,N,1);
			neta = 0.2 + ((0.8 * alpha * alpha) /(beta *fabs(slstep[0])));
			
			for (i = 0; i < N;++i) {
				v[i] = neta * dx[i] *sN[i] - ssd[i];
			}
			
			if (delta == -1.0) {
				if (clen < maxstep) {
					delta = clen;
				} else {
					delta = maxstep;
				}
			}
			
		}
		
		if (neta * nlen <= delta) {
			tvec = delta / nlen;
			for(i = 0; i < N;++i) {
				step[i] = tvec * sN[i];
			}
		} else if (clen >= delta) {
			tvec = delta /clen;
			for (i = 0; i < N;++i) {
				step[i] = tvec * ssd[i] / dx[i];
			}
		} else {
			mmult(v,ssd,t1,1,N,1);
			mmult(v,v,t2,1,N,1);
			lambda = (-t1[0] + sqrt(t1[0]*t1[0] - t2[0]*(clen*clen - delta*delta)))/t2[0];
			
			for (i = 0; i < N; ++i) {
				step[i] = (ssd[i] / dx[i]) + (lambda * v[i] / dx[i] );
			}
		}
		
			
	}
	
	ioval[0] = delta; ioval[1] = clen; ioval[2] = neta;
	
	free(temp1);
	free(t1);
	free(t2);
	free(slstep);
}